

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O3

Point3f pbrt::weightOneRing(SDVertex *vert,Float beta)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined1 auVar4 [16];
  SDFace *pSVar5;
  long lVar6;
  uint uVar7;
  Point3f *pPVar8;
  float fVar9;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 in_ZMM1 [64];
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  Point3f PVar15;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  polymorphic_allocator<pbrt::Point3<float>_> local_118;
  Tuple3<pbrt::Point3,_float> local_110;
  undefined1 local_100 [208];
  size_t local_30;
  size_t local_28;
  
  pSVar5 = vert->startFace;
  if (vert->boundary == false) {
    uVar7 = 0;
    do {
      pSVar5 = SDFace::nextFace(pSVar5,vert);
      auVar11 = in_ZMM1._4_12_;
      uVar7 = uVar7 + 1;
    } while (pSVar5 != vert->startFace);
  }
  else {
    uVar7 = 0;
    do {
      pSVar5 = SDFace::nextFace(pSVar5,vert);
      uVar7 = uVar7 + 1;
    } while (pSVar5 != (SDFace *)0x0);
    pSVar5 = vert->startFace;
    do {
      pSVar5 = SDFace::prevFace(pSVar5,vert);
      auVar11 = in_ZMM1._4_12_;
      uVar7 = uVar7 + 1;
    } while (pSVar5 != (SDFace *)0x0);
  }
  local_118.memoryResource = pstd::pmr::new_delete_resource();
  local_110.z = 0.0;
  local_110.x = 0.0;
  local_110.y = 0.0;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_100,(long)(int)uVar7,(Point3<float> *)&local_110,&local_118);
  pPVar8 = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pPVar8 = (Point3f *)(local_100 + 0x10);
  }
  SDVertex::oneRing(vert,pPVar8);
  auVar4._4_4_ = in_XMM0_Db;
  auVar4._0_4_ = beta;
  auVar4._8_4_ = in_XMM0_Dc;
  auVar4._12_4_ = in_XMM0_Dd;
  auVar10._0_4_ = (float)(int)uVar7;
  auVar10._4_12_ = auVar11;
  uVar1 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
  auVar4 = vfnmadd213ss_fma(auVar10,auVar4,ZEXT416(0x3f800000));
  pPVar8 = (Point3f *)(local_100 + 0x10);
  if ((Point3f *)local_100._8_8_ != (Point3f *)0x0) {
    pPVar8 = (Point3f *)local_100._8_8_;
  }
  lVar6 = 0;
  fVar9 = auVar4._0_4_;
  auVar13._0_4_ = fVar9 * (float)uVar1;
  auVar13._4_4_ = fVar9 * (float)uVar3;
  auVar13._8_4_ = fVar9 * 0.0;
  auVar13._12_4_ = fVar9 * 0.0;
  fVar9 = fVar9 * (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
  do {
    fVar9 = fVar9 + beta * *(float *)((long)&(pPVar8->super_Tuple3<pbrt::Point3,_float>).z + lVar6);
    uVar2 = *(undefined8 *)((long)&(pPVar8->super_Tuple3<pbrt::Point3,_float>).x + lVar6);
    lVar6 = lVar6 + 0xc;
    fVar12 = auVar13._0_4_ + (float)uVar2 * beta;
    fVar14 = auVar13._4_4_ + (float)((ulong)uVar2 >> 0x20) * beta;
    auVar13 = CONCAT412(auVar13._12_4_ + beta * 0.0,
                        CONCAT48(auVar13._8_4_ + beta * 0.0,CONCAT44(fVar14,fVar12)));
  } while ((ulong)uVar7 * 0xc != lVar6);
  local_28 = 0;
  (*(*(_func_int ***)local_100._0_8_)[3])(local_100._0_8_,local_100._8_8_,local_30 * 0xc,4);
  PVar15.super_Tuple3<pbrt::Point3,_float>.z = fVar9;
  PVar15.super_Tuple3<pbrt::Point3,_float>.x = fVar12;
  PVar15.super_Tuple3<pbrt::Point3,_float>.y = fVar14;
  return (Point3f)PVar15.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

static Point3f weightOneRing(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - valence * beta) * vert->p;
    for (int i = 0; i < valence; ++i)
        p += beta * pRing[i];
    return p;
}